

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  int iVar1;
  int iVar2;
  int ObjType;
  Vec_Int_t *pVVar3;
  int *pInputs;
  int *pFanins;
  int local_68;
  int nFanins;
  int Output;
  int Count;
  int Size;
  int Token;
  int ModuleID;
  int i;
  Vec_Int_t *vCur;
  Vec_Int_t *vFanins;
  Vec_Int_t *vTypes;
  Vec_Int_t *vWires;
  Vec_Int_t *vOutputs;
  Vec_Int_t *vInputs;
  Ndr_Data_t *pDesign;
  Abc_Nam_t *pNames_local;
  Vec_Int_t *vBuffer_local;
  
  vInputs = (Vec_Int_t *)0x0;
  pDesign = (Ndr_Data_t *)pNames;
  pNames_local = (Abc_Nam_t *)vBuffer;
  vOutputs = Vec_IntAlloc(100);
  vWires = Vec_IntAlloc(100);
  vTypes = Vec_IntAlloc(100);
  vFanins = Vec_IntAlloc(100);
  vCur = Vec_IntAlloc(100);
  _ModuleID = (Vec_Int_t *)0x0;
  nFanins = 0;
  iVar1 = Vec_IntEntry((Vec_Int_t *)pNames_local,0);
  if (iVar1 != 1) {
    __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0xeb,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
  }
  for (Token = 2; iVar1 = Token, iVar2 = Vec_IntSize((Vec_Int_t *)pNames_local), iVar1 < iVar2;
      Token = Token + 1) {
    Count = Vec_IntEntry((Vec_Int_t *)pNames_local,Token);
    if ((_ModuleID != (Vec_Int_t *)0x0) || (Count < 0xe)) {
      if (Count == 2) break;
      if (Count == 3) {
        _ModuleID = vOutputs;
      }
      else if (Count == 4) {
        _ModuleID = vWires;
      }
      else if (Count == 5) {
        _ModuleID = vTypes;
      }
      else if ((Count < 6) || (0xd < Count)) {
        Vec_IntPush(_ModuleID,Count);
      }
      else {
        Vec_IntPush(vFanins,Count);
        pVVar3 = vFanins;
        iVar1 = Vec_IntSize(vCur);
        Vec_IntPush(pVVar3,iVar1);
        _ModuleID = vCur;
      }
    }
  }
  Vec_IntPush(vFanins,-1);
  pVVar3 = vFanins;
  iVar1 = Vec_IntSize(vCur);
  Vec_IntPush(pVVar3,iVar1);
  iVar1 = Vec_IntEntry((Vec_Int_t *)pNames_local,1);
  pVVar3 = (Vec_Int_t *)Ndr_Create(iVar1);
  vInputs = pVVar3;
  iVar1 = Vec_IntEntry((Vec_Int_t *)pNames_local,1);
  Size = Ndr_AddModule(pVVar3,iVar1);
  pVVar3 = vInputs;
  iVar1 = Vec_IntSize(vOutputs);
  Ndr_DataResize((Ndr_Data_t *)pVVar3,iVar1);
  for (Token = 0; iVar1 = Token, iVar2 = Vec_IntSize(vOutputs), pVVar3 = vInputs, iVar1 < iVar2;
      Token = Token + 1) {
    Count = Vec_IntEntry(vOutputs,Token);
    Ndr_DataPush((Ndr_Data_t *)vInputs,4,Count);
  }
  iVar1 = Size + -0x100;
  iVar2 = Vec_IntSize(vOutputs);
  Ndr_DataAddTo((Ndr_Data_t *)pVVar3,iVar1,iVar2);
  pVVar3 = vInputs;
  iVar1 = Vec_IntSize(vOutputs);
  Ndr_DataAddTo((Ndr_Data_t *)pVVar3,0,iVar1);
  pVVar3 = vInputs;
  iVar1 = Vec_IntSize(vWires);
  Ndr_DataResize((Ndr_Data_t *)pVVar3,iVar1);
  for (Token = 0; iVar1 = Token, iVar2 = Vec_IntSize(vWires), pVVar3 = vInputs, iVar1 < iVar2;
      Token = Token + 1) {
    Count = Vec_IntEntry(vWires,Token);
    Ndr_DataPush((Ndr_Data_t *)vInputs,5,Count);
  }
  iVar1 = Size + -0x100;
  iVar2 = Vec_IntSize(vWires);
  Ndr_DataAddTo((Ndr_Data_t *)pVVar3,iVar1,iVar2);
  pVVar3 = vInputs;
  iVar1 = Vec_IntSize(vWires);
  Ndr_DataAddTo((Ndr_Data_t *)pVVar3,0,iVar1);
  pVVar3 = vInputs;
  iVar1 = Vec_IntSize(vTypes);
  Ndr_DataResize((Ndr_Data_t *)pVVar3,iVar1);
  for (Token = 0; iVar1 = Token, iVar2 = Vec_IntSize(vTypes), iVar1 < iVar2; Token = Token + 1) {
    Count = Vec_IntEntry(vTypes,Token);
    iVar1 = Acb_WireIsTarget(Count,(Abc_Nam_t *)pDesign);
    if (iVar1 != 0) {
      Ndr_DataPush((Ndr_Data_t *)vInputs,10,Count);
      nFanins = nFanins + 1;
    }
  }
  Ndr_DataAddTo((Ndr_Data_t *)vInputs,Size + -0x100,nFanins);
  Ndr_DataAddTo((Ndr_Data_t *)vInputs,0,nFanins);
  for (Token = 0; iVar1 = Token, iVar2 = Vec_IntSize(vOutputs), iVar1 < iVar2; Token = Token + 1) {
    Count = Vec_IntEntry(vOutputs,Token);
    Ndr_AddObject(vInputs,Size,3,0,0,0,0,0,(int *)0x0,1,&Count,(char *)0x0);
  }
  Count = Abc_NamStrFind((Abc_Nam_t *)pDesign,"1\'b0");
  if (Count != 0) {
    Ndr_AddObject(vInputs,Size,7,0,0,0,0,0,(int *)0x0,1,&Count,(char *)0x0);
  }
  Count = Abc_NamStrFind((Abc_Nam_t *)pDesign,"1\'b1");
  if (Count != 0) {
    Ndr_AddObject(vInputs,Size,8,0,0,0,0,0,(int *)0x0,1,&Count,(char *)0x0);
  }
  for (Token = 0; iVar1 = Token + 1, iVar2 = Vec_IntSize(vFanins), iVar1 < iVar2; Token = Token + 2)
  {
    Count = Vec_IntEntry(vFanins,Token);
    Output = Vec_IntEntry(vFanins,Token + 1);
    if (0 < Count) {
      local_68 = Vec_IntEntry(vCur,Output);
      iVar2 = Vec_IntEntry(vFanins,Token + 3);
      iVar2 = iVar2 - Output;
      pInputs = Vec_IntEntryP(vCur,Output + 1);
      pVVar3 = vInputs;
      iVar1 = Size;
      ObjType = Acb_Type2Oper(Count);
      Ndr_AddObject(pVVar3,iVar1,ObjType,0,0,0,0,iVar2 + -1,pInputs,1,&local_68,(char *)0x0);
    }
  }
  for (Token = 0; iVar1 = Token, iVar2 = Vec_IntSize(vWires), iVar1 < iVar2; Token = Token + 1) {
    Count = Vec_IntEntry(vWires,Token);
    Ndr_AddObject(vInputs,Size,4,0,0,0,0,1,&Count,1,&Count,(char *)0x0);
  }
  Vec_IntFree(vOutputs);
  Vec_IntFree(vWires);
  Vec_IntFree(vTypes);
  Vec_IntFree(vFanins);
  Vec_IntFree(vCur);
  return vInputs;
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            //char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            //if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
            //    i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = (Ndr_Data_t *)Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}